

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.h
# Opt level: O3

LightRayRecord __thiscall cert::PointLight::visible(PointLight *this,Vec3 *point,Vec3 *normal)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  double dVar4;
  LightRayRecord LVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined4 local_48;
  float local_28;
  undefined4 uStack_24;
  
  fVar8 = (this->super_Light).position.x - point->x;
  fVar6 = (this->super_Light).position.y - point->y;
  fVar11 = (this->super_Light).position.z - point->z;
  fVar7 = fVar11 * fVar11 + fVar8 * fVar8 + fVar6 * fVar6;
  dVar3 = sqrt((double)(ulong)(uint)fVar7);
  dVar4 = sqrt((double)(ulong)(uint)fVar7);
  fVar7 = SUB84(dVar4,0);
  fVar7 = (fVar11 / fVar7) * normal->z + (fVar8 / fVar7) * normal->x + (fVar6 / fVar7) * normal->y;
  local_48 = CONCAT31(local_48._1_3_,0.0 < fVar7);
  fVar6 = this->strength;
  local_28 = SUB84(dVar3,0);
  uStack_24 = (undefined4)((ulong)dVar3 >> 0x20);
  local_28 = local_28 * local_28;
  uVar1 = (this->super_Light).color.x;
  uVar2 = (this->super_Light).color.y;
  auVar9._0_4_ = fVar6 * fVar7 * (float)uVar1;
  auVar9._4_4_ = fVar6 * fVar7 * (float)uVar2;
  auVar9._8_8_ = 0;
  auVar10._4_4_ = local_28;
  auVar10._0_4_ = local_28;
  auVar10._8_4_ = uStack_24;
  auVar10._12_4_ = uStack_24;
  auVar10 = divps(auVar9,auVar10);
  LVar5.attenuation.x = (float)(int)auVar10._0_8_;
  LVar5.attenuation.y = (float)(int)((ulong)auVar10._0_8_ >> 0x20);
  LVar5._0_4_ = local_48;
  LVar5.attenuation.z = ((this->super_Light).color.z * fVar7 * fVar6) / local_28;
  return LVar5;
}

Assistant:

constexpr LightRayRecord visible (Vec3 const& point, Vec3 const& normal) override
	{
		Vec3 direction = position - point;
		float distance = direction.length ();
		float lambert = dot (normal, normalize (direction));

		return { .visible = lambert > 0.0f, .attenuation = color * lambert * strength / (distance * distance) };
	}